

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<long_double>_>::MultAdd
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *x,
          TPZFMatrix<Fad<long_double>_> *y,TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *alpha,
          Fad<long_double> *beta,int opt)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Fad<long_double> *pFVar6;
  uint uVar7;
  int iVar8;
  longdouble *plVar9;
  long lVar10;
  long lVar11;
  longdouble *plVar12;
  long lVar13;
  ulong uVar14;
  int sz;
  long lVar15;
  Fad<long_double> val;
  long local_148;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> local_138;
  Fad<long_double> local_128;
  Fad<long_double> local_f8;
  longdouble *local_c0;
  Fad<long_double> *local_b8;
  Fad<long_double> *local_b0;
  Fad<long_double> **local_a8;
  Fad<long_double> *local_a0;
  Fad<long_double> local_98;
  Fad<long_double> local_68;
  
  if (((opt == 0) &&
      ((this->super_TPZBaseMatrix).fCol !=
       (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZBaseMatrix).fRow !=
      (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow)) {
    Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
  }
  if (((x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol !=
       (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  lVar2 = (this->super_TPZBaseMatrix).fRow;
  lVar3 = (this->super_TPZBaseMatrix).fCol;
  lVar4 = (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  local_98.val_ = beta->val_;
  uVar1 = (beta->dx_).num_elts;
  local_98.dx_.ptr_to_data = (longdouble *)0x0;
  local_98.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar14 = (long)(int)uVar1 << 4;
    }
    local_98.dx_.ptr_to_data = (longdouble *)operator_new__(uVar14);
    MEM_CPY<long_double>::copy
              ((MEM_CPY<long_double> *)local_98.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(beta->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_98.defaultVal = beta->defaultVal;
  PrepareZ(this,y,z,&local_98,opt);
  Fad<long_double>::~Fad(&local_98);
  local_128.val_ = (longdouble)0;
  local_128.dx_.num_elts = 0;
  local_128.dx_.ptr_to_data = (longdouble *)0x0;
  local_128.defaultVal._0_8_ = 0;
  local_128.defaultVal._8_2_ = 0;
  if (0 < lVar4) {
    local_c0 = &alpha->defaultVal;
    local_148 = 0;
    lVar10 = 0;
    do {
      if (opt == 0) {
        if (0 < lVar3) {
          lVar15 = 0;
          do {
            if (0 < lVar2) {
              lVar13 = 0;
              lVar11 = 0;
              do {
                if (((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow <= lVar11) ||
                   ((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol <= lVar10)) {
                  TPZFMatrix<Fad<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar5 = (z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
                pFVar6 = z->fElem;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_f8,this,lVar11,lVar15);
                local_b8 = alpha;
                local_b0 = &local_f8;
                (*(x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(&local_68,x,lVar15,lVar10);
                local_138.fadexpr_.left_ =
                     (Fad<long_double> *)((long)&pFVar6->val_ + lVar13 + lVar5 * local_148);
                local_a8 = &local_b8;
                local_138.fadexpr_.right_ = (Fad<long_double> *)&local_a8;
                local_a0 = &local_68;
                Fad<long_double>::operator=
                          (&local_128,
                           (FadExpr<FadBinaryAdd<Fad<long_double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>
                            *)&local_138);
                Fad<long_double>::~Fad(&local_68);
                Fad<long_double>::~Fad(&local_f8);
                (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(z,lVar11,lVar10);
                lVar11 = lVar11 + 1;
                lVar13 = lVar13 + 0x30;
              } while (lVar2 != lVar11);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != lVar3);
        }
      }
      else if (0 < lVar2) {
        lVar15 = 0;
        do {
          local_128.val_ = (longdouble)0;
          if (local_128.dx_.num_elts != 0) {
            local_f8.val_ = (longdouble)0;
            Vector<long_double>::operator=(&local_128.dx_,&local_f8.val_);
          }
          if (0 < lVar3) {
            lVar11 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_f8,this,lVar11,lVar15);
              (*(x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_68,x,lVar11);
              local_138.fadexpr_.left_ = &local_f8;
              local_138.fadexpr_.right_ = &local_68;
              Fad<long_double>::operator+=(&local_128,&local_138);
              Fad<long_double>::~Fad(&local_68);
              Fad<long_double>::~Fad(&local_f8);
              lVar11 = lVar11 + 1;
            } while (lVar3 != lVar11);
          }
          iVar8 = local_128.dx_.num_elts;
          local_f8.val_ = local_128.val_ * alpha->val_;
          uVar1 = (alpha->dx_).num_elts;
          uVar7 = local_128.dx_.num_elts;
          if (local_128.dx_.num_elts < (int)uVar1) {
            uVar7 = uVar1;
          }
          local_f8.dx_.num_elts = 0;
          local_f8.dx_.ptr_to_data = (longdouble *)0x0;
          if ((int)uVar7 < 1) {
            local_f8.defaultVal = (longdouble)0;
          }
          else {
            uVar14 = (ulong)uVar7;
            local_f8.dx_.num_elts = uVar7;
            local_f8.dx_.ptr_to_data = (longdouble *)operator_new__(uVar14 << 4);
            local_f8.defaultVal = (longdouble)0;
            if (0 < (int)uVar7) {
              lVar11 = 0;
              do {
                plVar9 = (longdouble *)((long)(alpha->dx_).ptr_to_data + lVar11);
                if (uVar1 == 0) {
                  plVar9 = local_c0;
                }
                plVar12 = (longdouble *)((long)local_128.dx_.ptr_to_data + lVar11);
                if (iVar8 == 0) {
                  plVar12 = &local_128.defaultVal;
                }
                *(longdouble *)((long)local_f8.dx_.ptr_to_data + lVar11) =
                     alpha->val_ * *plVar12 + local_128.val_ * *plVar9;
                lVar11 = lVar11 + 0x10;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
          }
          (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(z,lVar15,lVar10);
          Fad<long_double>::~Fad(&local_f8);
          lVar15 = lVar15 + 1;
        } while (lVar15 != lVar2);
      }
      lVar10 = lVar10 + 1;
      local_148 = local_148 + 0x30;
    } while (lVar10 != lVar4);
  }
  Fad<long_double>::~Fad(&local_128);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}